

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *this_00;
  Stack<std::unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *elem;
  long in_RDI;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffa8;
  DefaultKeepRecycled *in_stack_ffffffffffffffb0;
  DefaultKeepRecycled local_10 [16];
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                      *)0x85a138);
  if (bVar1) {
    self((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *)0x85a157);
    bVar1 = DefaultKeepRecycled::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((bVar1) &&
       ((Recycled<Lib::DHMap<unsigned_int,Kernel::TermList,Lib::DefaultHash,Lib::DefaultHash2>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
         ::memAlive & 1) != 0)) {
      this_00 = (Stack<std::unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
                 *)(in_RDI + 8);
      self((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)0x85a19c);
      DefaultReset::operator()((DefaultReset *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      elem = mem();
      in_stack_ffffffffffffffb0 = local_10;
      std::
      unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ::unique_ptr((unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                    *)in_stack_ffffffffffffffb0,
                   (unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                    *)in_stack_ffffffffffffffa8);
      Stack<std::unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
      ::push(this_00,(unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                      *)elem);
      std::
      unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ::~unique_ptr((unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                     *)in_stack_ffffffffffffffb0);
    }
  }
  std::
  unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ::~unique_ptr((unique_ptr<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }